

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxAssign::Resolve(FxAssign *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *this_00;
  FxIntCast *this_01;
  FxFloatCast *this_02;
  undefined4 extraout_var_01;
  FxTypeCast *this_03;
  undefined4 extraout_var_02;
  PClass *size;
  undefined1 local_2d [8];
  bool writable;
  FCompileContext *local_20;
  FCompileContext *ctx_local;
  FxAssign *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_20 = ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Base != (FxExpression *)0x0) {
      iVar2 = (*this->Base->_vptr_FxExpression[2])();
      this->Base = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Base == (FxExpression *)0x0) {
      if (this != (FxAssign *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxAssign *)0x0;
    }
    else {
      (this->super_FxExpression).ValueType = this->Base->ValueType;
      if (this->Right != (FxExpression *)0x0) {
        ctx = local_20;
        iVar2 = (*this->Right->_vptr_FxExpression[2])();
        this->Right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
      }
      if (this->Right == (FxExpression *)0x0) {
        if (this != (FxAssign *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxAssign *)0x0;
      }
      else if ((((this->IsModifyAssign & 1U) == 0) || (this->Base->ValueType != (PType *)TypeBool))
              || (this->Right->ValueType == (PType *)TypeBool)) {
        bVar1 = FxExpression::IsNumeric(this->Base);
        if ((bVar1) && (bVar1 = FxExpression::IsNumeric(this->Right), bVar1)) {
          if (this->Right->ValueType != (this->super_FxExpression).ValueType) {
            if ((this->super_FxExpression).ValueType == (PType *)TypeBool) {
              this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
              FxBoolCast::FxBoolCast(this_00,this->Right,true);
              this->Right = (FxExpression *)this_00;
            }
            else {
              iVar2 = PType::GetRegType((this->super_FxExpression).ValueType);
              if (iVar2 == 0) {
                this_01 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
                FxIntCast::FxIntCast(this_01,this->Right,(bool)(local_20->FromDecorate & 1),false);
                this->Right = (FxExpression *)this_01;
              }
              else {
                this_02 = (FxFloatCast *)
                          FxExpression::operator_new((FxExpression *)0x30,(size_t)ctx);
                FxFloatCast::FxFloatCast(this_02,this->Right);
                this->Right = (FxExpression *)this_02;
              }
            }
            if (this->Right != (FxExpression *)0x0) {
              iVar2 = (*this->Right->_vptr_FxExpression[2])(this->Right,local_20);
              this->Right = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
            }
            if (this->Right == (FxExpression *)0x0) {
              if (this != (FxAssign *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
          }
        }
        else if (this->Base->ValueType == this->Right->ValueType) {
          bVar1 = DObject::IsKindOf((DObject *)this->Base->ValueType,
                                    PArray::RegistrationInfo.MyClass);
          if (bVar1) {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,"Cannot assign arrays");
            if (this != (FxAssign *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          bVar1 = FxExpression::IsVector(this->Base);
          if ((!bVar1) &&
             (bVar1 = DObject::IsKindOf((DObject *)this->Base->ValueType,
                                        PStruct::RegistrationInfo.MyClass), bVar1)) {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Struct assignment not implemented yet");
            if (this != (FxAssign *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        else {
          size = PNativeStruct::RegistrationInfo.MyClass;
          bVar1 = DObject::IsA((DObject *)this->Right->ValueType,
                               PNativeStruct::RegistrationInfo.MyClass);
          if (((bVar1) &&
              (size = PPointer::RegistrationInfo.MyClass,
              bVar1 = DObject::IsKindOf((DObject *)this->Base->ValueType,
                                        PPointer::RegistrationInfo.MyClass), bVar1)) &&
             ((PType *)this->Base->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject ==
              this->Right->ValueType)) {
            (*this->Right->_vptr_FxExpression[4])(this->Right,local_20,local_2d);
            this->Right->ValueType = this->Base->ValueType;
          }
          else {
            this_03 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
            FxTypeCast::FxTypeCast(this_03,this->Right,this->Base->ValueType,false,false);
            this->Right = (FxExpression *)this_03;
            if (this->Right != (FxExpression *)0x0) {
              iVar2 = (*this->Right->_vptr_FxExpression[2])(this->Right,local_20);
              this->Right = (FxExpression *)CONCAT44(extraout_var_02,iVar2);
            }
            if (this->Right == (FxExpression *)0x0) {
              if (this != (FxAssign *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
          }
        }
        uVar3 = (*this->Base->_vptr_FxExpression[4])(this->Base,local_20,&this->AddressWritable);
        if (((uVar3 & 1) == 0) || ((this->AddressWritable & 1U) == 0)) {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Expression must be a modifiable value");
          if (this != (FxAssign *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxAssign *)0x0;
        }
        else {
          iVar2 = (*this->Base->_vptr_FxExpression[8])();
          this->IsBitWrite = iVar2;
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Invalid modify/assign operation with a boolean operand");
        if (this != (FxAssign *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxAssign *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxAssign::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Base, ctx);

	ValueType = Base->ValueType;

	SAFE_RESOLVE(Right, ctx);

	if (IsModifyAssign && Base->ValueType == TypeBool && Right->ValueType != TypeBool)
	{
		// If the modify operation resulted in a type promotion from bool to int, this must be blocked.
		// (this means, for bool, only &=, ^= and |= are allowed, although DECORATE is more lax.)
		ScriptPosition.Message(MSG_ERROR, "Invalid modify/assign operation with a boolean operand");
		delete this;
		return nullptr;
	}

	// keep the redundant handling for numeric types here to avoid problems with DECORATE.
	// for non-numerics FxTypeCast can be used without issues.
	if (Base->IsNumeric() && Right->IsNumeric())
	{
		if (Right->ValueType != ValueType)
		{
			if (ValueType == TypeBool)
			{
				Right = new FxBoolCast(Right);
			}
			else if (ValueType->GetRegType() == REGT_INT)
			{
				Right = new FxIntCast(Right, ctx.FromDecorate);
			}
			else
			{
				Right = new FxFloatCast(Right);
			}
			SAFE_RESOLVE(Right, ctx);
		}
	}
	else if (Base->ValueType == Right->ValueType)
	{
		if (Base->ValueType->IsKindOf(RUNTIME_CLASS(PArray)))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot assign arrays");
			delete this;
			return nullptr;
		}
		if (!Base->IsVector() && Base->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Struct assignment not implemented yet");
			delete this;
			return nullptr;
		}
		// Both types are the same so this is ok.
	}
	else if (Right->ValueType->IsA(RUNTIME_CLASS(PNativeStruct)) && Base->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer*>(Base->ValueType)->PointedType == Right->ValueType)
	{
		// allow conversion of native structs to pointers of the same type. This is necessary to assign elements from global arrays like players, sectors, etc. to local pointers.
		// For all other types this is not needed. Structs are not assignable and classes can only exist as references.
		bool writable;
		Right->RequestAddress(ctx, &writable);
		Right->ValueType = Base->ValueType;
	}
	else
	{
		// pass it to FxTypeCast for complete handling.
		Right = new FxTypeCast(Right, Base->ValueType, false);
		SAFE_RESOLVE(Right, ctx);
	}

	if (!Base->RequestAddress(ctx, &AddressWritable) || !AddressWritable)
	{
		ScriptPosition.Message(MSG_ERROR, "Expression must be a modifiable value");
		delete this;
		return nullptr;
	}

	// Special case: Assignment to a bitfield.
	IsBitWrite = Base->GetBitValue();
	return this;
}